

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.hpp
# Opt level: O2

ostream * operator<<(ostream *os,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  int i;
  ulong uVar2;
  
  std::operator<<(os,"[");
  for (uVar2 = 0;
      piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start,
      uVar2 < (ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar2 = uVar2 + 1) {
    std::ostream::operator<<((ostream *)os,piVar1[uVar2]);
    if (uVar2 != ((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2) - 1U) {
      std::operator<<(os,", ");
    }
  }
  std::operator<<(os,"]\n");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const vector<T>& v) 
{ 
    os << "["; 
    for (int i = 0; i < v.size(); ++i) { 
        os << v[i]; 
        if (i != v.size() - 1) 
            os << ", "; 
    } 
    os << "]\n"; 
    return os; 
}